

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::CutpoolPropagation::updateActivityUbChange
          (CutpoolPropagation *this,HighsInt col,double oldbound,double newbound)

{
  double *pdVar1;
  double dVar2;
  int cut;
  HighsCutPool *pHVar3;
  pointer pHVar4;
  HighsDomain *pHVar5;
  int iVar6;
  pointer piVar7;
  Reason RVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  HighsCDouble HVar13;
  
  lVar9 = (long)col;
  if (oldbound < newbound) {
    pHVar3 = this->cutpool;
    for (iVar6 = (pHVar3->matrix_).AheadPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar9]; iVar6 != -1;
        iVar6 = (pHVar3->matrix_).AnextPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar6]) {
      updateThresholdUbChange
                (this->domain,col,newbound,
                 (pHVar3->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar6],
                 (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 (pHVar3->matrix_).ARrowindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar6]);
    }
  }
  pHVar3 = this->cutpool;
  iVar6 = (pHVar3->matrix_).AheadNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9];
  do {
    if (iVar6 == -1) {
LAB_00296bba:
      if (this->domain->infeasible_ == true) {
        pHVar3 = this->cutpool;
        piVar7 = (pHVar3->matrix_).AheadNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        while (piVar7[lVar9] != -1) {
          lVar9 = (long)piVar7[lVar9];
          iVar6 = (pHVar3->matrix_).ARrowindex_.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar9];
          HVar13 = computeDelta((pHVar3->matrix_).ARvalue_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9],newbound,oldbound,INFINITY,
                                (this->activitycutsinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + iVar6);
          dVar11 = HVar13.hi;
          pHVar4 = (this->activitycuts_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pHVar4[iVar6].hi;
          dVar10 = dVar11 + dVar2;
          pHVar4[iVar6].hi = dVar10;
          pHVar4[iVar6].lo =
               (dVar2 - (dVar10 - dVar11)) + (dVar11 - (dVar10 - (dVar10 - dVar11))) +
               pHVar4[iVar6].lo + HVar13.lo;
          if ((this->domain->infeasible_reason).index == iVar6) {
            return;
          }
          piVar7 = (pHVar3->matrix_).AnextNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
        }
      }
      return;
    }
    cut = (pHVar3->matrix_).ARrowindex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar6];
    dVar2 = (pHVar3->matrix_).ARvalue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6];
    HVar13 = computeDelta(dVar2,oldbound,newbound,INFINITY,
                          (this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start + cut);
    dVar10 = HVar13.hi;
    pHVar4 = (this->activitycuts_).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar11 = pHVar4[cut].hi;
    dVar12 = dVar10 + dVar11;
    pHVar4[cut].hi = dVar12;
    dVar11 = (dVar11 - (dVar12 - dVar10)) + (dVar10 - (dVar12 - (dVar12 - dVar10))) + pHVar4[cut].lo
             + HVar13.lo;
    pHVar4[cut].lo = dVar11;
    if (dVar10 + HVar13.lo <= 0.0) {
      updateThresholdUbChange
                (this->domain,col,newbound,dVar2,
                 (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start + cut);
    }
    else {
      if ((this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[cut] == 0) {
        pHVar5 = this->domain;
        dVar2 = (this->cutpool->rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[cut];
        dVar10 = dVar12 - dVar2;
        dVar10 = dVar11 + (-dVar2 - (dVar10 - dVar12)) + (dVar12 - (dVar10 - (dVar10 - dVar12))) +
                 dVar10;
        pdVar1 = &((pHVar5->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
          pHVar5->infeasible_ = true;
          pHVar5->infeasible_pos =
               (HighsInt)
               ((ulong)((long)(pHVar5->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pHVar5->domchgstack_).
                             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
          RVar8.index = cut;
          RVar8.type = this->cutpoolindex;
          pHVar5->infeasible_reason = RVar8;
          goto LAB_00296bba;
        }
      }
      markPropagateCut(this,cut);
    }
    iVar6 = (pHVar3->matrix_).AnextNeg_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6];
  } while( true );
}

Assistant:

void HighsDomain::CutpoolPropagation::updateActivityUbChange(HighsInt col,
                                                             double oldbound,
                                                             double newbound) {
  assert(!domain->infeasible_);

  if (newbound > oldbound) {
    cutpool->getMatrix().forEachPositiveColumnEntry(
        col, [&](HighsInt row, double val) {
          domain->updateThresholdUbChange(col, newbound, val,
                                          capacityThreshold_[row]);
          return true;
        });
  }

  cutpool->getMatrix().forEachNegativeColumnEntry(
      col, [&](HighsInt row, double val) {
        assert(val < 0);
        HighsCDouble deltamin = computeDelta(val, oldbound, newbound, kHighsInf,
                                             activitycutsinf_[row]);
        activitycuts_[row] += deltamin;

        if (deltamin <= 0) {
          domain->updateThresholdUbChange(col, newbound, val,
                                          capacityThreshold_[row]);
          return true;
        }

        if (activitycutsinf_[row] == 0 &&
            activitycuts_[row] - cutpool->getRhs()[row] >
                domain->mipsolver->mipdata_->feastol) {
          domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
          domain->infeasible_ = true;
          domain->infeasible_pos = domain->domchgstack_.size();
          domain->infeasible_reason = Reason::cut(cutpoolindex, row);
          return false;
        }

        markPropagateCut(row);

        return true;
      });

  if (domain->infeasible_) {
    assert(domain->infeasible_reason.type == cutpoolindex);
    assert(domain->infeasible_reason.index >= 0);
    std::swap(oldbound, newbound);
    cutpool->getMatrix().forEachNegativeColumnEntry(
        col, [&](HighsInt row, double val) {
          assert(val < 0);
          activitycuts_[row] += computeDelta(val, oldbound, newbound, kHighsInf,
                                             activitycutsinf_[row]);

          if (domain->infeasible_reason.index == row) return false;

          return true;
        });
  }
}